

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event_Report_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Event_Report_PDU::Decode(Event_Report_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  FixedDatum *this_01;
  VariableDatum *this_02;
  int iVar3;
  KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> local_d8;
  KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> local_c0;
  VariableDatum *local_a8;
  VariableDatum *p_1;
  KUINT32 datumID_1;
  KUINT16 pos_1;
  KUINT16 i_1;
  KRef_Ptr<KDIS::DATA_TYPE::FixedDatum> local_80;
  FixedDatum *local_68;
  FixedDatum *p;
  KUINT32 datumID;
  KUINT16 pos;
  KUINT16 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Event_Report_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x28) {
    datumID._3_1_ = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    datumID._3_1_ = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Simulation_Management_Header::Decode
            ((Simulation_Management_Header *)this,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = KDataStream::operator>>(pKStack_18,&this->m_ui32EventType);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui32Padding);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_Comment_PDU).m_ui32NumFixedDatum);
  KDataStream::operator>>(pKVar2,&(this->super_Comment_PDU).m_ui32NumVariableDatum);
  for (datumID._0_2_ = 0; (uint)(ushort)datumID < (this->super_Comment_PDU).m_ui32NumFixedDatum;
      datumID._0_2_ = (ushort)datumID + 1) {
    p._6_2_ = KDataStream::GetCurrentWritePosition(pKStack_18);
    KDataStream::operator>>(pKStack_18,(uint *)&p);
    KDataStream::SetCurrentWritePosition(pKStack_18,p._6_2_);
    local_68 = DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::FixedDatum>::FactoryDecode
                         ((KINT32)p,pKStack_18);
    if (local_68 == (FixedDatum *)0x0) {
      this_01 = (FixedDatum *)operator_new(0x10);
      DATA_TYPE::FixedDatum::FixedDatum(this_01,pKStack_18);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>::KRef_Ptr
                ((KRef_Ptr<KDIS::DATA_TYPE::FixedDatum> *)&datumID_1,this_01);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
      ::push_back(&(this->super_Comment_PDU).m_vFixedDatum,
                  (KRef_Ptr<KDIS::DATA_TYPE::FixedDatum> *)&datumID_1);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>::~KRef_Ptr
                ((KRef_Ptr<KDIS::DATA_TYPE::FixedDatum> *)&datumID_1);
    }
    else {
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>::KRef_Ptr(&local_80,local_68);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
      ::push_back(&(this->super_Comment_PDU).m_vFixedDatum,&local_80);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>::~KRef_Ptr(&local_80);
    }
  }
  for (p_1._6_2_ = 0; (uint)p_1._6_2_ < (this->super_Comment_PDU).m_ui32NumVariableDatum;
      p_1._6_2_ = p_1._6_2_ + 1) {
    p_1._4_2_ = KDataStream::GetCurrentWritePosition(pKStack_18);
    KDataStream::operator>>(pKStack_18,(uint *)&p_1);
    KDataStream::SetCurrentWritePosition(pKStack_18,p_1._4_2_);
    local_a8 = DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::VariableDatum>::FactoryDecode
                         ((KINT32)p_1,pKStack_18);
    if (local_a8 == (VariableDatum *)0x0) {
      this_02 = (VariableDatum *)operator_new(0x28);
      DATA_TYPE::VariableDatum::VariableDatum(this_02,pKStack_18);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::KRef_Ptr(&local_d8,this_02);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
      ::push_back(&(this->super_Comment_PDU).m_vVariableDatum,&local_d8);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::~KRef_Ptr(&local_d8);
    }
    else {
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::KRef_Ptr(&local_c0,local_a8);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
      ::push_back(&(this->super_Comment_PDU).m_vVariableDatum,&local_c0);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::~KRef_Ptr(&local_c0);
    }
  }
  return;
}

Assistant:

void Event_Report_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < EVENT_REPORT_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    stream >> m_ui32EventType
           >> m_ui32Padding
           >> m_ui32NumFixedDatum
           >> m_ui32NumVariableDatum;

    // FixedDatum
    for( KUINT16 i = 0; i < m_ui32NumFixedDatum; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT32 datumID;

        // Extract the datum id then reset the stream.
        stream >> datumID;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        FixedDatum * p = FixedDatum::FactoryDecode( datumID, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vFixedDatum.push_back( FixDtmPtr( p ) );
        }
        else
        {
            // Default
            m_vFixedDatum.push_back( FixDtmPtr( new FixedDatum( stream ) ) );
        }
    }

    // VariableDatum
    for( KUINT16 i = 0; i < m_ui32NumVariableDatum; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT32 datumID;

        // Extract the datum id then reset the stream.
        stream >> datumID;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        VariableDatum * p = VariableDatum::FactoryDecode( datumID, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vVariableDatum.push_back( VarDtmPtr( p ) );
        }
        else
        {
            // Default
            m_vVariableDatum.push_back( VarDtmPtr( new VariableDatum( stream ) ) );
        }
    }
}